

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O2

Vec_Wec_t *
Acec_FindXorLeaves(Gia_Man_t *p,Vec_Int_t *vXors,Vec_Int_t *vAdds,Vec_Int_t *vXorRoots,
                  Vec_Int_t *vRanks,Vec_Wec_t **pvAddBoxes)

{
  int i;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Bit_t *p_00;
  Vec_Int_t *p_01;
  Vec_Wec_t *pVVar6;
  Vec_Wec_t *pVVar7;
  Vec_Wec_t *p_02;
  int iVar8;
  int iVar9;
  
  p_00 = Acec_MapXorOuts2(p,vXors,vRanks);
  p_01 = Acec_MapMajOuts2(p,vAdds,vRanks);
  pVVar6 = Vec_WecStart(vXorRoots->nSize);
  pVVar7 = Vec_WecStart(vXorRoots->nSize);
  iVar8 = 0;
  iVar5 = 0;
  do {
    if (vXors->nSize <= iVar5 * 4) {
      Vec_BitFree(p_00);
      Vec_IntFree(p_01);
      if (pvAddBoxes != (Vec_Wec_t **)0x0) {
        *pvAddBoxes = pVVar7;
      }
      return pVVar6;
    }
    i = Vec_IntEntry(vXors,iVar5 * 4);
    iVar1 = Vec_IntEntry(vRanks,i);
    if (iVar1 != -1) {
      for (iVar9 = 1; iVar9 != 4; iVar9 = iVar9 + 1) {
        iVar2 = Vec_IntEntry(vXors,iVar9 + iVar8);
        if (iVar2 != 0) {
          iVar3 = Vec_BitEntry(p_00,iVar2);
          if (iVar3 == 0) {
            iVar4 = Vec_IntEntry(p_01,iVar2);
            p_02 = pVVar6;
            iVar3 = iVar1;
            if (iVar4 != -1) {
              iVar3 = Vec_IntEntry(vRanks,i);
              if (iVar3 < 1) goto LAB_00547868;
              iVar2 = Vec_IntEntry(p_01,iVar2);
              p_02 = pVVar7;
              iVar3 = iVar1 + -1;
            }
            Vec_WecPush(p_02,iVar3,iVar2);
          }
          else {
            iVar2 = Vec_IntEntry(vRanks,iVar2);
            if (iVar1 != iVar2) {
              __assert_fail("Rank == Vec_IntEntry(vRanks, Fanin)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecXor.c"
                            ,0xf8,
                            "Vec_Wec_t *Acec_FindXorLeaves(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t **)"
                           );
            }
          }
        }
LAB_00547868:
      }
    }
    iVar5 = iVar5 + 1;
    iVar8 = iVar8 + 4;
  } while( true );
}

Assistant:

Vec_Wec_t * Acec_FindXorLeaves( Gia_Man_t * p, Vec_Int_t * vXors, Vec_Int_t * vAdds, Vec_Int_t * vXorRoots, Vec_Int_t * vRanks, Vec_Wec_t ** pvAddBoxes )
{
    Vec_Bit_t * vMapXors = Acec_MapXorOuts2( p, vXors, vRanks );
    Vec_Int_t * vMapMajs = Acec_MapMajOuts2( p, vAdds, vRanks );
    Vec_Wec_t * vXorLeaves = Vec_WecStart( Vec_IntSize(vXorRoots) );
    Vec_Wec_t * vAddBoxes  = Vec_WecStart( Vec_IntSize(vXorRoots) );
    int i, k;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
    {
        int Xor = Vec_IntEntry(vXors, 4*i);
        int Rank = Vec_IntEntry(vRanks, Xor);
        if ( Rank == -1 )
            continue;
        for ( k = 1; k < 4; k++ )
        {
            int Fanin = Vec_IntEntry(vXors, 4*i+k);
            //int RankFanin = Vec_IntEntry(vRanks, Fanin);
            if ( Fanin == 0 )
                continue;
            if ( Vec_BitEntry(vMapXors, Fanin) )
            {
                assert( Rank == Vec_IntEntry(vRanks, Fanin) );
                continue;
            }
//            if ( Vec_BitEntry(vMapXors, Fanin) && Rank == RankFanin )
//                continue;
            if ( Vec_IntEntry(vMapMajs, Fanin) == -1 ) // no adder driving this input
                Vec_WecPush( vXorLeaves, Rank, Fanin );
            else if ( Vec_IntEntry(vRanks, Xor) > 0 ) // save adder box
                Vec_WecPush( vAddBoxes, Rank-1, Vec_IntEntry(vMapMajs, Fanin) );
        }
    }
    Vec_BitFree( vMapXors );
    Vec_IntFree( vMapMajs );
    if ( pvAddBoxes )
        *pvAddBoxes = vAddBoxes;
    return vXorLeaves;
}